

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeblock.cpp
# Opt level: O2

CodeBlock * __thiscall cppgenerate::CodeBlock::operator=(CodeBlock *this,CodeBlock *other)

{
  allocator local_39;
  string local_38 [32];
  
  if (this != other) {
    this->m_indent = other->m_indent;
    std::__cxx11::string::string(local_38,"",&local_39);
    std::__cxx11::stringbuf::str((string *)&this->field_0x8);
    std::__cxx11::string::~string(local_38);
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)this,local_38);
    std::__cxx11::string::~string(local_38);
  }
  return this;
}

Assistant:

CodeBlock& CodeBlock::operator=( const CodeBlock& other ){
    if( this != &other ){
        m_indent = other.m_indent;
        m_text.str( "" );
        m_text << other.m_text.str();
    }

    return *this;
}